

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::WriteModelItem(MemoryWriter *wrt,QuadAndLinTerms *qlt,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  
  WriteModelItem(wrt,&qlt->super_LinTerms,vnam);
  if ((qlt->super_QuadTerms).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0) {
    if ((qlt->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      value.size_ = 3;
      value.data_ = " + ";
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    }
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
    WriteModelItem(wrt,&qlt->super_QuadTerms,vnam);
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,')');
    return;
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadAndLinTerms& qlt,
                    ItemNamer& vnam) {
  WriteModelItem(wrt, qlt.GetLinTerms(), vnam);
  if (qlt.GetQPTerms().size()) {
    if (qlt.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, qlt.GetQPTerms(), vnam);
    wrt << ')';
  }
}